

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# argparse.c
# Opt level: O0

argparse_result_t argparse_exec(int argc,char **argv,argparse_callback_fn *callback)

{
  bool bVar1;
  bool bVar2;
  char cVar3;
  int iVar4;
  char *pcVar5;
  char *pcVar6;
  bool bVar7;
  argparse_result_t local_94;
  argparse_result_t result_1;
  adt_error_t rc_3;
  adt_error_t rc_2;
  adt_error_t rc_1;
  adt_error_t rc;
  argparse_result_t result;
  char *p;
  uint equal_count;
  uint minus_count;
  int arg_len;
  char c;
  _Bool has_long_name;
  _Bool has_short_name;
  adt_str_t str;
  adt_str_t long_name;
  adt_str_t short_name;
  int arg_id;
  argparse_callback_fn *callback_local;
  char **argv_local;
  int argc_local;
  
  if (argc < 2) {
    argv_local._4_4_ = ARGPARSE_SUCCESS;
  }
  else if ((argv == (char **)0x0) || (callback == (argparse_callback_fn *)0x0)) {
    argv_local._4_4_ = ARGPARSE_INVALID_ARGUMENT_ERROR;
  }
  else {
    bVar1 = false;
    bVar2 = false;
    adt_str_create(&arg_len);
    adt_str_create(&long_name.lastError);
    adt_str_create(&str.lastError);
    for (short_name._20_4_ = 1; (int)short_name._20_4_ < argc;
        short_name._20_4_ = short_name._20_4_ + 1) {
      p._4_4_ = 0;
      _rc_3 = argv[(int)short_name._20_4_];
      adt_str_clear(&arg_len);
      minus_count._1_1_ = *_rc_3;
      while (minus_count._1_1_ == '-') {
        p._4_4_ = p._4_4_ + 1;
        minus_count._1_1_ = _rc_3[1];
        _rc_3 = _rc_3 + 1;
      }
      minus_count._1_1_ = *_rc_3;
      while (minus_count._1_1_ != '\0' && minus_count._1_1_ != '=') {
        adt_str_push(&arg_len,(int)minus_count._1_1_);
        minus_count._1_1_ = _rc_3[1];
        _rc_3 = _rc_3 + 1;
      }
      bVar7 = minus_count._1_1_ == '=';
      if (bVar7) {
        _rc_3 = _rc_3 + 1;
      }
      iVar4 = adt_str_length(&arg_len);
      if ((iVar4 < 1) || (2 < p._4_4_)) {
        if ((iVar4 != 0) || (p._4_4_ != 1)) {
          adt_str_destroy(&arg_len);
          adt_str_destroy(&long_name.lastError);
          adt_str_destroy(&str.lastError);
          return ARGPARSE_PARSE_ERROR;
        }
        if (bVar1) {
          bVar1 = false;
          pcVar5 = (char *)adt_str_cstr(&long_name.lastError);
          local_94 = (*callback)(pcVar5,(char *)0x0,"-");
        }
        else if (bVar2) {
          bVar2 = false;
          pcVar5 = (char *)adt_str_cstr(&str.lastError);
          local_94 = (*callback)((char *)0x0,pcVar5,"-");
        }
        else {
          local_94 = (*callback)((char *)0x0,(char *)0x0,"-");
        }
        if (local_94 < ARGPARSE_SUCCESS) {
          adt_str_destroy(&arg_len);
          adt_str_destroy(&long_name.lastError);
          adt_str_destroy(&str.lastError);
          return local_94;
        }
      }
      else {
        result_1 = ARGPARSE_PARSE_ERROR;
        if (p._4_4_ == 0) {
          if (bVar1) {
            bVar1 = false;
            pcVar5 = (char *)adt_str_cstr(&long_name.lastError);
            pcVar6 = (char *)adt_str_cstr(&arg_len);
            result_1 = (*callback)(pcVar5,(char *)0x0,pcVar6);
          }
          else if (bVar2) {
            bVar2 = false;
            pcVar5 = (char *)adt_str_cstr(&str.lastError);
            pcVar6 = (char *)adt_str_cstr(&arg_len);
            result_1 = (*callback)((char *)0x0,pcVar5,pcVar6);
          }
          else {
            pcVar5 = (char *)adt_str_cstr(&arg_len);
            result_1 = (*callback)((char *)0x0,(char *)0x0,pcVar5);
          }
        }
        else if (p._4_4_ == 1) {
          if (bVar7) {
            if (bVar7) {
              cVar3 = adt_str_set(&long_name.lastError,&arg_len);
              if (cVar3 != '\0') {
                adt_str_destroy(&arg_len);
                adt_str_destroy(&long_name.lastError);
                adt_str_destroy(&str.lastError);
                return ARGPARSE_MEM_ERROR;
              }
              adt_str_clear(&arg_len);
              minus_count._1_1_ = *_rc_3;
              while (minus_count._1_1_ != '\0') {
                adt_str_push(&arg_len,(int)minus_count._1_1_);
                minus_count._1_1_ = _rc_3[1];
                _rc_3 = _rc_3 + 1;
              }
              pcVar5 = (char *)adt_str_cstr(&long_name.lastError);
              pcVar6 = (char *)adt_str_cstr(&arg_len);
              result_1 = (*callback)(pcVar5,(char *)0x0,pcVar6);
            }
          }
          else {
            pcVar5 = (char *)adt_str_cstr(&arg_len);
            result_1 = (*callback)(pcVar5,(char *)0x0,(char *)0x0);
            if (result_1 == ARGPARSE_NEED_VALUE) {
              cVar3 = adt_str_set(&long_name.lastError,&arg_len);
              bVar1 = true;
              if (cVar3 != '\0') {
                adt_str_destroy(&arg_len);
                adt_str_destroy(&long_name.lastError);
                adt_str_destroy(&str.lastError);
                return ARGPARSE_MEM_ERROR;
              }
            }
          }
        }
        else if (p._4_4_ == 2) {
          if (bVar7) {
            if (bVar7) {
              cVar3 = adt_str_set(&str.lastError,&arg_len);
              if (cVar3 != '\0') {
                adt_str_destroy(&arg_len);
                adt_str_destroy(&long_name.lastError);
                adt_str_destroy(&str.lastError);
                return ARGPARSE_MEM_ERROR;
              }
              adt_str_clear(&arg_len);
              minus_count._1_1_ = *_rc_3;
              while (minus_count._1_1_ != '\0') {
                adt_str_push(&arg_len,(int)minus_count._1_1_);
                minus_count._1_1_ = _rc_3[1];
                _rc_3 = _rc_3 + 1;
              }
              pcVar5 = (char *)adt_str_cstr(&str.lastError);
              pcVar6 = (char *)adt_str_cstr(&arg_len);
              result_1 = (*callback)((char *)0x0,pcVar5,pcVar6);
            }
          }
          else {
            pcVar5 = (char *)adt_str_cstr(&arg_len);
            result_1 = (*callback)((char *)0x0,pcVar5,(char *)0x0);
            if (result_1 == ARGPARSE_NEED_VALUE) {
              cVar3 = adt_str_set(&str.lastError,&arg_len);
              bVar2 = true;
              if (cVar3 != '\0') {
                adt_str_destroy(&arg_len);
                adt_str_destroy(&long_name.lastError);
                adt_str_destroy(&str.lastError);
                return ARGPARSE_MEM_ERROR;
              }
            }
          }
        }
        if (result_1 < ARGPARSE_SUCCESS) {
          adt_str_destroy(&arg_len);
          adt_str_destroy(&long_name.lastError);
          adt_str_destroy(&str.lastError);
          return result_1;
        }
      }
    }
    adt_str_destroy(&arg_len);
    adt_str_destroy(&long_name.lastError);
    adt_str_destroy(&str.lastError);
    argv_local._4_4_ = ARGPARSE_SUCCESS;
  }
  return argv_local._4_4_;
}

Assistant:

argparse_result_t argparse_exec(int argc, const char **argv, argparse_callback_fn *callback)
{
   if ( argc < 2)
   {
      return ARGPARSE_SUCCESS; //Nothing to parse
   }
   if ( (argv != 0) && (callback != 0) )
   {
      int arg_id;
      adt_str_t short_name;
      adt_str_t long_name;
      adt_str_t str;
      bool has_short_name = false;
      bool has_long_name = false;
      adt_str_create(&str);
      adt_str_create(&short_name);
      adt_str_create(&long_name);

      for (arg_id = 1; arg_id < argc; arg_id++)
      {
         char c;
         int arg_len;
         unsigned int minus_count = 0u;
         unsigned int equal_count = 0u;
         const char *p = argv[arg_id];
         adt_str_clear(&str);
         for(c= *p; c == '-'; c = *(++p))
         {
            minus_count++;
         }
         for(c = *p; (c != '\0') && (c != '='); c = *(++p))
         {
            adt_str_push(&str, c);
         }
         if (c == '=')
         {
            equal_count++;
            p++;
         }
         arg_len = adt_str_length(&str);
         if ( (arg_len > 0) && (minus_count <= 2u))
         {
            argparse_result_t result = ARGPARSE_PARSE_ERROR;
            switch(minus_count)
            {
            case 0u:
               if (has_short_name)
               {
                  has_short_name = false;
                  result = callback(adt_str_cstr(&short_name), (const char*) 0, adt_str_cstr(&str));
               }
               else if (has_long_name)
               {
                  has_long_name = false;
                  result = callback((const char*) 0, adt_str_cstr(&long_name), adt_str_cstr(&str));
               }
               else
               {
                  //positional argument
                  result = callback((const char*) 0, (const char*) 0, adt_str_cstr(&str));
               }
               break;
            case 1u:
               if (equal_count == 0)
               {
                  result = callback(adt_str_cstr(&str), (const char*) 0, (const char*) 0);
                  if (result == ARGPARSE_NEED_VALUE)
                  {
                     adt_error_t rc = adt_str_set(&short_name, &str);
                     has_short_name = true;
                     if (rc != ADT_NO_ERROR)
                     {
                        ARGPARSE_DESTROY_VARS();
                        return ARGPARSE_MEM_ERROR;
                     }
                  }
               }
               else if (equal_count == 1)
               {
                  adt_error_t rc = adt_str_set(&short_name, &str);
                  if (rc != ADT_NO_ERROR)
                  {
                     ARGPARSE_DESTROY_VARS();
                     return ARGPARSE_MEM_ERROR;
                  }
                  adt_str_clear(&str);
                  for(c = *p; (c != '\0') ; c = *(++p))
                  {
                     adt_str_push(&str, c);
                  }
                  result = callback(adt_str_cstr(&short_name), (const char*) 0, adt_str_cstr(&str));
               }
               else
               {
                  //parse error already set as default
               }
               break;
            case 2u:
               if (equal_count==0)
               {
                  result = callback((const char*) 0, adt_str_cstr(&str), (const char*) 0);
                  if (result == ARGPARSE_NEED_VALUE)
                  {
                     adt_error_t rc = adt_str_set(&long_name, &str);
                     has_long_name = true;
                     if (rc != ADT_NO_ERROR)
                     {
                        ARGPARSE_DESTROY_VARS();
                        return ARGPARSE_MEM_ERROR;
                     }
                  }
               }
               else if (equal_count == 1)
               {
                  adt_error_t rc = adt_str_set(&long_name, &str);
                  if (rc != ADT_NO_ERROR)
                  {
                     ARGPARSE_DESTROY_VARS();
                     return ARGPARSE_MEM_ERROR;
                  }
                  adt_str_clear(&str);
                  for(c = *p; (c != '\0') ; c = *(++p))
                  {
                     adt_str_push(&str, c);
                  }
                  result = callback((const char*) 0, adt_str_cstr(&long_name), adt_str_cstr(&str));
               }
               else
               {
                  //parse error already set as default
               }
               break;
            }
            if (result < 0)
            {
               ARGPARSE_DESTROY_VARS();
               return result;
            }
         }
         else if ((arg_len == 0) && (minus_count == 1))
         {
            /* A standalone minus sign is sometimes used as a positional argument to mean
               stdin/stdout instead of a file name. */

            argparse_result_t result;
            if (has_short_name)
            {
               has_short_name = false;
               result = callback(adt_str_cstr(&short_name), (const char*) 0, "-");
            }
            else if (has_long_name)
            {
               has_long_name = false;
               result = callback((const char*) 0, adt_str_cstr(&long_name), "-");
            }
            else
            {
               result = callback((const char*) 0, (const char*) 0, "-");
            }

            if (result < 0)
            {
               ARGPARSE_DESTROY_VARS();
               return result;
            }
         }
         else
         {
            //User gave empty arg or just typed minus sign(s) with nothing following it or typed three or more minus signs.
            ARGPARSE_DESTROY_VARS();
            return ARGPARSE_PARSE_ERROR;
         }
      }
      ARGPARSE_DESTROY_VARS();
      return ARGPARSE_SUCCESS;
   }
   return ARGPARSE_INVALID_ARGUMENT_ERROR;
}